

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O0

void __thiscall diy::Master::unload(Master *this,vector<int,_std::allocator<int>_> *loaded)

{
  ulong uVar1;
  size_type sVar2;
  Master *in_RSI;
  uint i;
  uint i_00;
  
  i_00 = 0;
  while( true ) {
    uVar1 = (ulong)i_00;
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)in_RSI);
    if (sVar2 <= uVar1) break;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_RSI,(ulong)i_00);
    unload(in_RSI,i_00);
    i_00 = i_00 + 1;
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x149271);
  return;
}

Assistant:

void          unload(std::vector<int>& loaded)    { for(unsigned i = 0; i < loaded.size(); ++i) unload(loaded[i]); loaded.clear(); }